

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AssemblyCommand.cpp
# Opt level: O3

void __thiscall
AssemblyCode::AddRegConstCommand::AddRegConstCommand
          (AddRegConstCommand *this,CTemp *leftOperand,int constant)

{
  pointer pcVar1;
  
  (this->super_AssemblyCommand)._vptr_AssemblyCommand = (_func_int **)&PTR_GetIn_00182ef0;
  (this->leftOperand).name._M_dataplus._M_p = (pointer)&(this->leftOperand).name.field_2;
  pcVar1 = (leftOperand->name)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->leftOperand,pcVar1,pcVar1 + (leftOperand->name)._M_string_length);
  this->constant = constant;
  return;
}

Assistant:

AssemblyCode::AddRegConstCommand::AddRegConstCommand( const IRT::CTemp leftOperand, int constant ) : leftOperand(
        leftOperand ), constant( constant ) { }